

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * anon_unknown.dwarf_13f878f::GetScanCommand
                   (string *__return_storage_ptr__,string *cmakeCmd,string *tdi,string *lang,
                   string *ppFile,string *ddiFile)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined8 local_88;
  char *local_80;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  char *local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  char *local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  char *local_20;
  size_type local_18;
  pointer local_10;
  
  local_98._M_str = (cmakeCmd->_M_dataplus)._M_p;
  local_98._M_len = cmakeCmd->_M_string_length;
  local_88 = 0x1e;
  local_80 = " -E cmake_ninja_depends --tdi=";
  local_70 = (tdi->_M_dataplus)._M_p;
  local_78 = tdi->_M_string_length;
  local_68 = 8;
  local_60 = " --lang=";
  local_50 = (lang->_M_dataplus)._M_p;
  local_58 = lang->_M_string_length;
  local_48 = 6;
  local_40 = " --pp=";
  local_30 = (ppFile->_M_dataplus)._M_p;
  local_38 = ppFile->_M_string_length;
  local_28 = 0x27;
  local_20 = " --dep=$DEP_FILE --obj=$OBJ_FILE --ddi=";
  local_10 = (ddiFile->_M_dataplus)._M_p;
  local_18 = ddiFile->_M_string_length;
  views._M_len = 9;
  views._M_array = &local_98;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string GetScanCommand(const std::string& cmakeCmd, const std::string& tdi,
                           const std::string& lang, const std::string& ppFile,
                           const std::string& ddiFile)
{
  return cmStrCat(cmakeCmd, " -E cmake_ninja_depends --tdi=", tdi,
                  " --lang=", lang, " --pp=", ppFile,
                  " --dep=$DEP_FILE --obj=$OBJ_FILE --ddi=", ddiFile);
}